

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::OnRead(cmProcess *this,ssize_t nread,uv_buf_t *buf)

{
  bool bVar1;
  pointer pcVar2;
  ostream *poVar3;
  char *pcVar4;
  cmCTest *this_00;
  uv_timer_s *handle;
  string local_210 [32];
  undefined1 local_1f0 [8];
  ostringstream cmCTestLog_msg;
  int error;
  undefined1 local_60 [8];
  string strdata;
  string line;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  cmProcess *this_local;
  
  std::__cxx11::string::string((string *)(strdata.field_2._M_local_buf + 8));
  if (nread < 1) {
    if (nread != 0) {
      if (nread != -0xfff) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
        poVar3 = std::operator<<((ostream *)local_1f0,"Error reading stream: ");
        pcVar4 = uv_strerror((int)nread);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                           (&this->Runner);
        this_00 = cmCTestRunTest::GetCTest(pcVar2);
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                     ,0xf0,pcVar4,false);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      }
      bVar1 = Buffer::GetLast(&this->Output,(string *)((long)&strdata.field_2 + 8));
      if (bVar1) {
        pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                           (&this->Runner);
        cmCTestRunTest::CheckOutput(pcVar2,(string *)((long)&strdata.field_2 + 8));
      }
      this->ReadHandleClosed = true;
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
                ((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader);
      if ((this->ProcessHandleClosed & 1U) != 0) {
        handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_((uv_handle_ptr_ *)&this->Timer);
        uv_timer_stop(handle);
        Finish(this);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)local_60);
    cmProcessOutput::DecodeText(&this->Conv,buf->base,nread,(string *)local_60,0);
    ::cm::
    append<cmProcess::Buffer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&this->Output,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    while (bVar1 = Buffer::GetLine(&this->Output,(string *)((long)&strdata.field_2 + 8)), bVar1) {
      pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                         (&this->Runner);
      cmCTestRunTest::CheckOutput(pcVar2,(string *)((long)&strdata.field_2 + 8));
      std::__cxx11::string::clear();
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  std::__cxx11::string::~string((string *)(strdata.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmProcess::OnRead(ssize_t nread, const uv_buf_t* buf)
{
  std::string line;
  if (nread > 0) {
    std::string strdata;
    this->Conv.DecodeText(buf->base, static_cast<size_t>(nread), strdata);
    cm::append(this->Output, strdata);

    while (this->Output.GetLine(line)) {
      this->Runner->CheckOutput(line);
      line.clear();
    }

    return;
  }

  if (nread == 0) {
    return;
  }

  // The process will provide no more data.
  if (nread != UV_EOF) {
    auto error = static_cast<int>(nread);
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error reading stream: " << uv_strerror(error) << std::endl);
  }

  // Look for partial last lines.
  if (this->Output.GetLast(line)) {
    this->Runner->CheckOutput(line);
  }

  this->ReadHandleClosed = true;
  this->PipeReader.reset();
  if (this->ProcessHandleClosed) {
    uv_timer_stop(this->Timer);
    this->Finish();
  }
}